

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O3

int32_t trun::to_int32(char *str)

{
  int iVar1;
  long *__nptr;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  allocator<char> local_51;
  long *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,str,&local_51);
  __nptr = local_48[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol((char *)__nptr,(char **)&local_50,10);
  if (local_50 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    return (int)lVar3;
  }
  uVar4 = std::__throw_out_of_range("stoi");
  if (*piVar2 == 0) {
    *piVar2 = iVar1;
  }
  to_int32();
  _Unwind_Resume(uVar4);
}

Assistant:

int32_t to_int32(const char *str) {
        return std::stoi(str);
    }